

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

void read_inter_frame_mode_info(AV1Decoder *pbi,DecoderCodingBlock *dcb,aom_reader *r)

{
  od_ec_dec *poVar1;
  short *psVar2;
  aom_cdf_prob *paVar3;
  nmv_context *pnVar4;
  uint8_t *puVar5;
  BLOCK_SIZE BVar6;
  ushort uVar7;
  ushort uVar8;
  MB_MODE_INFO *pMVar9;
  MB_MODE_INFO *pMVar10;
  MB_MODE_INFO *pMVar11;
  FRAME_CONTEXT *pFVar12;
  SequenceHeader *pSVar13;
  int iVar14;
  nmv_component *pnVar15;
  int8_t iVar16;
  UV_PREDICTION_MODE UVar17;
  uint8_t uVar18;
  undefined1 uVar19;
  char cVar20;
  char cVar21;
  MOTION_MODE MVar22;
  COMPOUND_TYPE CVar23;
  short sVar24;
  ushort uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int_mv iVar29;
  int iVar30;
  ulong uVar31;
  int8_t ref_idx;
  byte bVar32;
  MV_REFERENCE_FRAME MVar33;
  PREDICTION_MODE PVar34;
  byte bVar35;
  short sVar36;
  long lVar37;
  uint16_t *puVar38;
  ulong uVar39;
  RefCntBuffer *pRVar40;
  char cVar41;
  scale_factors *psVar42;
  aom_cdf_prob (*paaVar43) [3];
  aom_cdf_prob (*icdf) [6] [3];
  aom_cdf_prob (*paaaVar44) [3] [3];
  aom_cdf_prob (*icdf_00) [2] [3];
  aom_cdf_prob (*icdf_01) [9];
  aom_cdf_prob (*paaVar45) [4];
  aom_cdf_prob (*icdf_02) [5];
  DecoderCodingBlock *pDVar46;
  char cVar47;
  uint uVar48;
  FRAME_CONTEXT *pFVar49;
  RefCntBuffer *pRVar50;
  long lVar51;
  int8_t ref_idx_2;
  uint uVar52;
  nmv_context *nmvc;
  AV1_COMMON *cm;
  ulong uVar53;
  AV1Decoder *pAVar54;
  bool bVar55;
  int_mv iVar56;
  int_mv iVar57;
  int_mv iVar58;
  int_mv iVar59;
  undefined8 local_260;
  undefined8 local_258;
  FRAME_CONTEXT *local_250;
  undefined2 local_242;
  od_ec_dec *local_240;
  AV1Decoder *local_238;
  int_mv *local_230;
  FRAME_CONTEXT *local_228;
  DecoderCodingBlock *local_220;
  ulong local_218;
  uint local_20c;
  int_mv local_208;
  uint32_t local_204;
  AV1_COMMON *local_200;
  undefined8 local_1f8;
  nmv_component *local_1f0;
  nmv_component *local_1e8;
  ulong local_1e0;
  int pts_inref [16];
  int pts [16];
  int16_t inter_mode_ctx [29];
  int_mv ref_mvs [29] [2];
  
  cm = &pbi->common;
  pMVar9 = *(dcb->xd).mi;
  pMVar9->mv[0] = (int_mv)0x0;
  pMVar9->mv[1] = (int_mv)0x0;
  uVar26 = read_inter_segment_id(cm,&dcb->xd,1,r);
  uVar26 = uVar26 & 7;
  *(ushort *)&pMVar9->field_0xa7 = *(ushort *)&pMVar9->field_0xa7 & 0xfff8 | (ushort)uVar26;
  uVar27 = 0;
  if (((pbi->common).current_frame.skip_mode_info.skip_mode_flag != 0) &&
     ((uVar18 = (pbi->common).seg.enabled, uVar18 == '\0' ||
      (((pbi->common).seg.feature_mask[uVar26] & 0x40) == 0)))) {
    BVar6 = (*(dcb->xd).mi)->bsize;
    bVar32 = block_size_high[BVar6];
    if (block_size_wide[BVar6] < block_size_high[BVar6]) {
      bVar32 = block_size_wide[BVar6];
    }
    if ((7 < bVar32) &&
       ((uVar18 == '\0' || (uVar27 = 0, ((pbi->common).seg.feature_mask[uVar26] & 0xa0) == 0)))) {
      pMVar10 = (dcb->xd).left_mbmi;
      pMVar11 = (dcb->xd).above_mbmi;
      if (pMVar11 == (MB_MODE_INFO *)0x0) {
        uVar39 = 0;
      }
      else {
        uVar39 = (ulong)(*(ushort *)&pMVar11->field_0xa7 >> 6 & 1);
      }
      if (pMVar10 == (MB_MODE_INFO *)0x0) {
        uVar53 = 0;
      }
      else {
        uVar53 = (ulong)(*(ushort *)&pMVar10->field_0xa7 >> 6 & 1);
      }
      lVar37 = uVar53 + uVar39;
      pFVar12 = (dcb->xd).tile_ctx;
      paaVar43 = pFVar12->skip_mode_cdfs + lVar37;
      uVar27 = od_ec_decode_cdf_q15(&r->ec,*paaVar43,2);
      if (r->allow_update_cdf != '\0') {
        uVar25 = pFVar12->skip_mode_cdfs[lVar37][2];
        bVar32 = (char)(uVar25 >> 4) + 4;
        uVar7 = (*paaVar43)[0];
        if ((char)uVar27 < '\x01') {
          sVar36 = -(uVar7 >> (bVar32 & 0x1f));
        }
        else {
          sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
        }
        (*paaVar43)[0] = sVar36 + uVar7;
        pFVar12->skip_mode_cdfs[lVar37][2] = uVar25 + (uVar25 < 0x20);
      }
    }
  }
  uVar25 = *(ushort *)&pMVar9->field_0xa7;
  *(ushort *)&pMVar9->field_0xa7 = uVar25 & 0xffbf | (ushort)((uVar27 & 1) << 6);
  uVar18 = '\x01';
  if ((uVar27 & 1) == 0) {
    iVar28 = read_skip_txfm(cm,&dcb->xd,uVar25 & 7,r);
    uVar18 = (uint8_t)iVar28;
  }
  pMVar9->skip_txfm = uVar18;
  if ((pbi->common).seg.segid_preskip == '\0') {
    iVar28 = read_inter_segment_id(cm,&dcb->xd,0,r);
    *(ushort *)&pMVar9->field_0xa7 = *(ushort *)&pMVar9->field_0xa7 & 0xfff8 | (ushort)iVar28 & 7;
  }
  read_cdef(cm,r,&dcb->xd);
  read_delta_q_params(cm,&dcb->xd,r);
  if ((*(ushort *)&pMVar9->field_0xa7 & 0x40) == 0) {
    if ((pbi->common).seg.enabled == '\0') {
LAB_0017fe67:
      iVar28 = av1_get_intra_inter_context(&dcb->xd);
      pFVar12 = (dcb->xd).tile_ctx;
      paaVar43 = pFVar12->intra_inter_cdf + iVar28;
      uVar26 = od_ec_decode_cdf_q15(&r->ec,*paaVar43,2);
      if (r->allow_update_cdf != '\0') {
        uVar25 = pFVar12->intra_inter_cdf[iVar28][2];
        bVar32 = (char)(uVar25 >> 4) + 4;
        uVar7 = (*paaVar43)[0];
        if ((char)uVar26 < '\x01') {
          sVar36 = -(uVar7 >> (bVar32 & 0x1f));
        }
        else {
          sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
        }
        (*paaVar43)[0] = sVar36 + uVar7;
        pFVar12->intra_inter_cdf[iVar28][2] = uVar25 + (uVar25 < 0x20);
      }
    }
    else {
      uVar26 = *(ushort *)&pMVar9->field_0xa7 & 7;
      uVar27 = (pbi->common).seg.feature_mask[uVar26];
      if ((uVar27 & 0x20) == 0) {
        uVar26 = 1;
        if (-1 < (char)uVar27) goto LAB_0017fe67;
      }
      else {
        uVar26 = (uint)(0 < *(short *)((long)(pbi->common).seg.feature_data[0] +
                                      (ulong)(uVar26 << 4) + 10));
      }
    }
    bVar55 = uVar26 == 0;
  }
  else {
    bVar55 = false;
  }
  pMVar9->current_qindex = (dcb->xd).current_base_qindex;
  (dcb->xd).above_txfm_context =
       (pbi->common).above_contexts.txfm[(dcb->xd).tile.tile_row] + (dcb->xd).mi_col;
  (dcb->xd).left_txfm_context = (dcb->xd).left_txfm_context_buffer + ((dcb->xd).mi_row & 0x1f);
  BVar6 = pMVar9->bsize;
  local_218 = (ulong)BVar6;
  local_238 = pbi;
  if (bVar55) {
    pMVar9->ref_frame[0] = '\0';
    pMVar9->ref_frame[1] = -1;
    pFVar12 = (dcb->xd).tile_ctx;
    bVar32 = read_intra_mode(r,pFVar12->y_mode_cdf[""[local_218]]);
    pMVar9->mode = bVar32;
    iVar16 = '\0';
    if ((BLOCK_8X4 < BVar6) && (iVar16 = '\0', 0xf7 < (byte)(bVar32 - 9))) {
      iVar28 = read_angle_delta(r,pFVar12->angle_delta_cdf[(ulong)bVar32 - 1]);
      iVar16 = (int8_t)iVar28;
    }
    pMVar9->angle_delta[0] = iVar16;
    lVar37 = 3;
    if ((((local_238->common).seq_params)->monochrome == '\0') && ((dcb->xd).is_chroma_ref == true))
    {
      pMVar10 = *(dcb->xd).mi;
      uVar39 = (ulong)pMVar10->bsize;
      if ((dcb->xd).lossless[*(ushort *)&pMVar10->field_0xa7 & 7] == 0) {
        bVar55 = (0x2f0bffUL >> (uVar39 & 0x3f) & 1) != 0;
        if ((0x1f07ffUL >> (uVar39 & 0x3f) & 1) == 0) {
          bVar55 = false;
        }
      }
      else {
        bVar55 = av1_ss_size_lookup[uVar39][(dcb->xd).plane[1].subsampling_x]
                 [(dcb->xd).plane[1].subsampling_y] == BLOCK_4X4;
      }
      UVar17 = read_intra_mode_uv(pFVar12,r,bVar55,pMVar9->mode);
      pMVar9->uv_mode = UVar17;
      if (UVar17 == '\r') {
        uVar18 = read_cfl_alphas((dcb->xd).tile_ctx,r,&pMVar9->cfl_alpha_signs);
        pMVar9->cfl_alpha_idx = uVar18;
      }
      uVar19 = 0;
      lVar37 = 0x59;
      if ((BLOCK_8X4 < BVar6) && (0xf7 < (byte)(get_uv_mode_uv2y[pMVar9->uv_mode] - 9))) {
        iVar28 = read_angle_delta(r,pFVar12->angle_delta_cdf
                                    [(ulong)(byte)get_uv_mode_uv2y[pMVar9->uv_mode] - 1]);
        uVar19 = (undefined1)iVar28;
      }
    }
    else {
      uVar19 = 0;
    }
    *(undefined1 *)((long)pMVar9->mv + lVar37 + -8) = uVar19;
    if (((local_238->common).seq_params)->monochrome == '\0') {
      uVar27 = 1;
      if ((dcb->xd).is_chroma_ref == true) {
        pMVar10 = *(dcb->xd).mi;
        if ((pMVar10->field_0xa7 & 0x80) == 0) {
          uVar27 = 0;
          if (pMVar10->ref_frame[0] < '\x01') {
            uVar27 = (uint)(pMVar10->uv_mode == '\r');
          }
        }
        else {
          uVar27 = 0;
        }
      }
    }
    else {
      uVar27 = 0;
    }
    (dcb->xd).cfl.store_y = uVar27;
    (pMVar9->palette_mode_info).palette_size[0] = '\0';
    (pMVar9->palette_mode_info).palette_size[1] = '\0';
    if (((local_238->common).features.allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < BVar6 || ((0xe007U >> (BVar6 & 0x1f) & 1) == 0)))) {
      read_palette_mode_info(cm,&dcb->xd,r);
    }
    read_filter_intra_mode_info(cm,&dcb->xd,r);
    return;
  }
  local_1e8 = (nmv_component *)
              CONCAT44(local_1e8._4_4_,(uint)(pbi->common).features.allow_high_precision_mv);
  memset(ref_mvs,0,0xe8);
  local_228 = (dcb->xd).tile_ctx;
  pMVar9->uv_mode = '\0';
  (pMVar9->palette_mode_info).palette_size[0] = '\0';
  (pMVar9->palette_mode_info).palette_size[1] = '\0';
  (dcb->xd).neighbors_ref_counts[0] = '\0';
  (dcb->xd).neighbors_ref_counts[1] = '\0';
  (dcb->xd).neighbors_ref_counts[2] = '\0';
  (dcb->xd).neighbors_ref_counts[3] = '\0';
  (dcb->xd).neighbors_ref_counts[4] = '\0';
  (dcb->xd).neighbors_ref_counts[5] = '\0';
  (dcb->xd).neighbors_ref_counts[6] = '\0';
  (dcb->xd).neighbors_ref_counts[7] = '\0';
  bVar55 = (dcb->xd).left_available;
  if (((dcb->xd).up_available == true) &&
     ((pMVar10 = (dcb->xd).above_mbmi, (pMVar10->field_0xa7 & 0x80) != 0 ||
      ('\0' < pMVar10->ref_frame[0])))) {
    puVar5 = (dcb->xd).neighbors_ref_counts + pMVar10->ref_frame[0];
    *puVar5 = *puVar5 + '\x01';
    if (0 < (long)pMVar10->ref_frame[1]) {
      puVar5 = (dcb->xd).neighbors_ref_counts + pMVar10->ref_frame[1];
      *puVar5 = *puVar5 + '\x01';
    }
  }
  if ((bVar55 != false) &&
     ((pMVar10 = (dcb->xd).left_mbmi, (pMVar10->field_0xa7 & 0x80) != 0 ||
      ('\0' < pMVar10->ref_frame[0])))) {
    puVar5 = (dcb->xd).neighbors_ref_counts + pMVar10->ref_frame[0];
    *puVar5 = *puVar5 + '\x01';
    if (0 < (long)pMVar10->ref_frame[1]) {
      puVar5 = (dcb->xd).neighbors_ref_counts + pMVar10->ref_frame[1];
      *puVar5 = *puVar5 + '\x01';
    }
  }
  pMVar10 = *(dcb->xd).mi;
  local_200 = cm;
  if ((pMVar10->field_0xa7 & 0x40) == 0) {
    if ((pbi->common).seg.enabled == '\0') {
LAB_001801f4:
      BVar6 = pMVar10->bsize;
      bVar32 = block_size_high[BVar6];
      if (block_size_wide[BVar6] < block_size_high[BVar6]) {
        bVar32 = block_size_wide[BVar6];
      }
      if (bVar32 < 8) {
        uVar27 = 0;
      }
      else {
        bVar32 = (pbi->common).current_frame.reference_mode;
        uVar27 = (uint)bVar32;
        if (bVar32 == 2) {
          iVar28 = av1_get_reference_mode_context(&dcb->xd);
          pFVar12 = (dcb->xd).tile_ctx;
          paaVar43 = pFVar12->comp_inter_cdf + iVar28;
          uVar27 = od_ec_decode_cdf_q15(&r->ec,*paaVar43,2);
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->comp_inter_cdf[iVar28][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*paaVar43)[0];
            if ((char)uVar27 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*paaVar43)[0] = sVar36 + uVar7;
            pFVar12->comp_inter_cdf[iVar28][2] = uVar25 + (uVar25 < 0x20);
          }
        }
      }
      if ((char)uVar27 == '\0') {
        pFVar12 = (dcb->xd).tile_ctx;
        iVar28 = av1_get_pred_context_single_ref_p1(&dcb->xd);
        icdf = pFVar12->single_ref_cdf + iVar28;
        poVar1 = &r->ec;
        iVar30 = od_ec_decode_cdf_q15(poVar1,(uint16_t *)icdf,2);
        if (r->allow_update_cdf != '\0') {
          uVar25 = pFVar12->single_ref_cdf[iVar28][0][2];
          bVar32 = (char)(uVar25 >> 4) + 4;
          uVar7 = (*icdf)[0][0];
          if ((char)iVar30 < '\x01') {
            sVar36 = -(uVar7 >> (bVar32 & 0x1f));
          }
          else {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
          }
          (*icdf)[0][0] = sVar36 + uVar7;
          pFVar12->single_ref_cdf[iVar28][0][2] = uVar25 + (uVar25 < 0x20);
        }
        pFVar12 = (dcb->xd).tile_ctx;
        if (iVar30 == 0) {
          iVar28 = av1_get_pred_context_single_ref_p3(&dcb->xd);
          paaVar43 = pFVar12->single_ref_cdf[iVar28] + 2;
          iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->single_ref_cdf[iVar28][2][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*paaVar43)[0];
            if ((char)iVar30 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*paaVar43)[0] = sVar36 + uVar7;
            pFVar12->single_ref_cdf[iVar28][2][2] = uVar25 + (uVar25 < 0x20);
          }
          pFVar12 = (dcb->xd).tile_ctx;
          if (iVar30 == 0) {
            iVar28 = av1_get_pred_context_single_ref_p4(&dcb->xd);
            iVar28 = aom_read_symbol_(r,pFVar12->single_ref_cdf[iVar28][3],2);
            bVar55 = iVar28 == 0;
            cVar21 = '\x02';
          }
          else {
            iVar28 = av1_get_pred_context_single_ref_p5(&dcb->xd);
            paaVar43 = pFVar12->single_ref_cdf[iVar28] + 4;
            iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
            if (r->allow_update_cdf != '\0') {
              uVar25 = pFVar12->single_ref_cdf[iVar28][4][2];
              bVar32 = (char)(uVar25 >> 4) + 4;
              uVar7 = (*paaVar43)[0];
              if ((char)iVar30 < '\x01') {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              (*paaVar43)[0] = sVar36 + uVar7;
              pFVar12->single_ref_cdf[iVar28][4][2] = uVar25 + (uVar25 < 0x20);
            }
            bVar55 = iVar30 == 0;
            cVar21 = '\x04';
          }
LAB_00180a7c:
          MVar33 = cVar21 - bVar55;
        }
        else {
          iVar28 = av1_get_pred_context_single_ref_p2(&dcb->xd);
          paaVar43 = pFVar12->single_ref_cdf[iVar28] + 1;
          iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->single_ref_cdf[iVar28][1][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*paaVar43)[0];
            if ((char)iVar30 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*paaVar43)[0] = sVar36 + uVar7;
            pFVar12->single_ref_cdf[iVar28][1][2] = uVar25 + (uVar25 < 0x20);
          }
          MVar33 = '\a';
          if (iVar30 == 0) {
            pFVar12 = (dcb->xd).tile_ctx;
            iVar28 = av1_get_pred_context_single_ref_p6(&dcb->xd);
            paaVar43 = pFVar12->single_ref_cdf[iVar28] + 5;
            iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
            if (r->allow_update_cdf != '\0') {
              uVar25 = pFVar12->single_ref_cdf[iVar28][5][2];
              bVar32 = (char)(uVar25 >> 4) + 4;
              uVar7 = (*paaVar43)[0];
              if ((char)iVar30 < '\x01') {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              (*paaVar43)[0] = sVar36 + uVar7;
              pFVar12->single_ref_cdf[iVar28][5][2] = uVar25 + (uVar25 < 0x20);
            }
            bVar55 = iVar30 == 0;
            cVar21 = '\x06';
            goto LAB_00180a7c;
          }
        }
        pMVar9->ref_frame[0] = MVar33;
        pMVar9->ref_frame[1] = -1;
        cm = local_200;
        pbi = local_238;
      }
      else if ((uVar27 & 0xff) == 1) {
        iVar28 = av1_get_comp_reference_type_context(&dcb->xd);
        pFVar12 = (dcb->xd).tile_ctx;
        paaVar43 = pFVar12->comp_ref_type_cdf + iVar28;
        poVar1 = &r->ec;
        iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
        if (r->allow_update_cdf != '\0') {
          uVar25 = pFVar12->comp_ref_type_cdf[iVar28][2];
          bVar32 = (char)(uVar25 >> 4) + 4;
          uVar7 = (*paaVar43)[0];
          if ((char)iVar30 < '\x01') {
            sVar36 = -(uVar7 >> (bVar32 & 0x1f));
          }
          else {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
          }
          (*paaVar43)[0] = sVar36 + uVar7;
          pFVar12->comp_ref_type_cdf[iVar28][2] = uVar25 + (uVar25 < 0x20);
        }
        if ((char)iVar30 == '\0') {
          iVar28 = av1_get_pred_context_uni_comp_ref_p(&dcb->xd);
          pFVar12 = (dcb->xd).tile_ctx;
          paaaVar44 = pFVar12->uni_comp_ref_cdf + iVar28;
          iVar30 = od_ec_decode_cdf_q15(poVar1,(uint16_t *)paaaVar44,2);
          cm = local_200;
          pbi = local_238;
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->uni_comp_ref_cdf[iVar28][0][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*paaaVar44)[0][0];
            if ((char)iVar30 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*paaaVar44)[0][0] = sVar36 + uVar7;
            pFVar12->uni_comp_ref_cdf[iVar28][0][2] = uVar25 + (uVar25 < 0x20);
          }
          if (iVar30 == 0) {
            iVar28 = av1_get_pred_context_uni_comp_ref_p1(&dcb->xd);
            iVar28 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->uni_comp_ref_cdf[iVar28][1],2);
            if (iVar28 == 0) {
              pMVar9->ref_frame[0] = '\x01';
              pMVar9->ref_frame[1] = '\x02';
            }
            else {
              iVar28 = av1_get_pred_context_uni_comp_ref_p2(&dcb->xd);
              iVar28 = aom_read_symbol_(r,((dcb->xd).tile_ctx)->uni_comp_ref_cdf[iVar28][2],2);
              pMVar9->ref_frame[0] = '\x01';
              if (iVar28 == 0) {
                pMVar9->ref_frame[1] = '\x03';
              }
              else {
                pMVar9->ref_frame[1] = '\x04';
              }
            }
          }
          else {
            pMVar9->ref_frame[0] = '\x05';
            pMVar9->ref_frame[1] = '\a';
          }
        }
        else {
          iVar28 = av1_get_pred_context_comp_ref_p(&dcb->xd);
          pFVar12 = (dcb->xd).tile_ctx;
          paaaVar44 = pFVar12->comp_ref_cdf + iVar28;
          iVar30 = od_ec_decode_cdf_q15(poVar1,(uint16_t *)paaaVar44,2);
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->comp_ref_cdf[iVar28][0][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*paaaVar44)[0][0];
            if ((char)iVar30 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*paaaVar44)[0][0] = sVar36 + uVar7;
            pFVar12->comp_ref_cdf[iVar28][0][2] = uVar25 + (uVar25 < 0x20);
          }
          if (iVar30 == 0) {
            iVar28 = av1_get_pred_context_comp_ref_p1(&dcb->xd);
            pFVar12 = (dcb->xd).tile_ctx;
            paaVar43 = pFVar12->comp_ref_cdf[iVar28] + 1;
            iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
            if (r->allow_update_cdf != '\0') {
              uVar25 = pFVar12->comp_ref_cdf[iVar28][1][2];
              bVar32 = (char)(uVar25 >> 4) + 4;
              uVar7 = (*paaVar43)[0];
              if ((char)iVar30 < '\x01') {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              (*paaVar43)[0] = sVar36 + uVar7;
              pFVar12->comp_ref_cdf[iVar28][1][2] = uVar25 + (uVar25 < 0x20);
            }
            cVar21 = '\x02';
          }
          else {
            iVar28 = av1_get_pred_context_comp_ref_p2(&dcb->xd);
            pFVar12 = (dcb->xd).tile_ctx;
            paaVar43 = pFVar12->comp_ref_cdf[iVar28] + 2;
            iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
            if (r->allow_update_cdf != '\0') {
              uVar25 = pFVar12->comp_ref_cdf[iVar28][2][2];
              bVar32 = (char)(uVar25 >> 4) + 4;
              uVar7 = (*paaVar43)[0];
              if ((char)iVar30 < '\x01') {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              (*paaVar43)[0] = sVar36 + uVar7;
              pFVar12->comp_ref_cdf[iVar28][2][2] = uVar25 + (uVar25 < 0x20);
            }
            cVar21 = '\x04';
          }
          pMVar9->ref_frame[0] = cVar21 - (iVar30 == 0);
          iVar28 = av1_get_pred_context_comp_bwdref_p(&dcb->xd);
          pFVar12 = (dcb->xd).tile_ctx;
          icdf_00 = pFVar12->comp_bwdref_cdf + iVar28;
          iVar30 = od_ec_decode_cdf_q15(poVar1,(uint16_t *)icdf_00,2);
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->comp_bwdref_cdf[iVar28][0][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*icdf_00)[0][0];
            if ((char)iVar30 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*icdf_00)[0][0] = sVar36 + uVar7;
            pFVar12->comp_bwdref_cdf[iVar28][0][2] = uVar25 + (uVar25 < 0x20);
          }
          if (iVar30 == 0) {
            iVar28 = av1_get_pred_context_comp_bwdref_p1(&dcb->xd);
            pFVar12 = (dcb->xd).tile_ctx;
            paaVar43 = pFVar12->comp_bwdref_cdf[iVar28] + 1;
            iVar30 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
            if (r->allow_update_cdf != '\0') {
              uVar25 = pFVar12->comp_bwdref_cdf[iVar28][1][2];
              bVar32 = (char)(uVar25 >> 4) + 4;
              uVar7 = (*paaVar43)[0];
              if ((char)iVar30 < '\x01') {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              (*paaVar43)[0] = sVar36 + uVar7;
              pFVar12->comp_bwdref_cdf[iVar28][1][2] = uVar25 + (uVar25 < 0x20);
            }
            pMVar9->ref_frame[1] = '\x06' - (iVar30 == 0);
            cm = local_200;
            pbi = local_238;
          }
          else {
            pMVar9->ref_frame[1] = '\a';
            cm = local_200;
            pbi = local_238;
          }
        }
      }
    }
    else {
      uVar26 = *(ushort *)&pMVar9->field_0xa7 & 7;
      uVar27 = (pbi->common).seg.feature_mask[uVar26];
      if ((uVar27 & 0x20) == 0) {
        if ((uVar27 & 0xc0) == 0) goto LAB_001801f4;
        pMVar9->ref_frame[0] = '\x01';
        pMVar9->ref_frame[1] = -1;
      }
      else {
        pMVar9->ref_frame[0] =
             *(MV_REFERENCE_FRAME *)
              ((long)(pbi->common).seg.feature_data[0] + (ulong)(uVar26 << 4) + 10);
        pMVar9->ref_frame[1] = -1;
      }
    }
  }
  else {
    pMVar9->ref_frame[0] = (char)(pbi->common).current_frame.skip_mode_info.ref_frame_idx_0 + '\x01'
    ;
    pMVar9->ref_frame[1] = (char)(pbi->common).current_frame.skip_mode_info.ref_frame_idx_1 + '\x01'
    ;
  }
  cVar21 = pMVar9->ref_frame[0];
  cVar47 = pMVar9->ref_frame[1];
  if ('\0' < cVar47) {
    cVar20 = -1;
    if (cVar47 < '\x05' || '\x04' < cVar21) {
      lVar37 = 0;
      do {
        if ((cVar21 == (&comp_ref0_lut)[lVar37]) && (cVar47 == (&comp_ref1_lut)[lVar37])) {
          cVar20 = (char)lVar37;
          break;
        }
        lVar37 = lVar37 + 1;
      } while (lVar37 != 9);
    }
    if (cVar20 < '\0') {
      cVar21 = cVar47 * '\x04' + cVar21 + -0xd;
    }
    else {
      cVar21 = cVar20 + '\x14';
    }
  }
  local_230 = (int_mv *)dcb->ref_mv_count;
  local_1f0 = (nmv_component *)(dcb->xd).ref_mv_stack;
  local_240 = (od_ec_dec *)(dcb->xd).weight;
  local_20c = CONCAT31(local_20c._1_3_,cVar21);
  av1_find_mv_refs(cm,&dcb->xd,pMVar9,cVar21,(uint8_t *)&local_230->as_int,
                   (CANDIDATE_MV (*) [8])local_1f0,(uint16_t (*) [8])local_240,ref_mvs,(int_mv *)0x0
                   ,inter_mode_ctx);
  pFVar12 = local_228;
  uVar25 = *(ushort *)&pMVar9->field_0xa7;
  *(ushort *)&pMVar9->field_0xa7 = uVar25 & 0xffcf;
  PVar34 = '\x11';
  local_1f8 = CONCAT71((int7)((ulong)r >> 8),cVar47);
  local_220 = dcb;
  if (((uVar25 & 0x40) == 0) &&
     (((pbi->common).seg.enabled == '\0' ||
      (PVar34 = '\x0f', ((pbi->common).seg.feature_mask[uVar25 & 7] & 0xc0) == 0)))) {
    cVar21 = pMVar9->ref_frame[0];
    cVar20 = pMVar9->ref_frame[1];
    if ('\0' < cVar20) {
      cVar41 = -1;
      if (cVar20 < '\x05' || '\x04' < cVar21) {
        lVar37 = 0;
        do {
          if ((cVar21 == (&comp_ref0_lut)[lVar37]) && (cVar20 == (&comp_ref1_lut)[lVar37])) {
            cVar41 = (char)lVar37;
            break;
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 != 9);
      }
      if (cVar41 < '\0') {
        cVar21 = cVar20 * '\x04' + cVar21 + -0xd;
      }
      else {
        cVar21 = cVar41 + '\x14';
      }
    }
    puVar38 = (uint16_t *)(inter_mode_ctx + cVar21);
    if ('\0' < cVar20) {
      uVar27 = *puVar38 & 7;
      uVar39 = 4;
      if ((ushort)uVar27 < 4) {
        uVar39 = (ulong)uVar27;
      }
      puVar38 = compound_mode_ctx_map[*puVar38 >> 5 & 7] + uVar39;
    }
    local_250 = (FRAME_CONTEXT *)&r->ec;
    uVar25 = *puVar38;
    uVar39 = (ulong)(short)uVar25;
    if (cVar47 < '\x01') {
      uVar27 = uVar25 & 7;
      paaVar43 = local_228->newmv_cdf + uVar27;
      local_1e0 = uVar39;
      iVar28 = od_ec_decode_cdf_q15((od_ec_dec *)local_250,*paaVar43,2);
      pFVar49 = local_228;
      if (r->allow_update_cdf != '\0') {
        uVar7 = pFVar12->newmv_cdf[uVar27][2];
        bVar32 = (char)(uVar7 >> 4) + 4;
        uVar8 = (*paaVar43)[0];
        if ((char)iVar28 < '\x01') {
          sVar36 = -(uVar8 >> (bVar32 & 0x1f));
        }
        else {
          sVar36 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar32 & 0x1f));
        }
        (*paaVar43)[0] = sVar36 + uVar8;
        pFVar12->newmv_cdf[uVar27][2] = uVar7 + (uVar7 < 0x20);
      }
      if (iVar28 == 0) {
        bVar32 = 0x10;
      }
      else {
        uVar27 = uVar25 >> 3 & 1;
        paaVar43 = local_228->zeromv_cdf + uVar27;
        iVar28 = od_ec_decode_cdf_q15((od_ec_dec *)local_250,*paaVar43,2);
        pFVar12 = local_228;
        if (r->allow_update_cdf != '\0') {
          uVar25 = pFVar49->zeromv_cdf[uVar27][2];
          bVar32 = (char)(uVar25 >> 4) + 4;
          uVar7 = (*paaVar43)[0];
          if ((char)iVar28 < '\x01') {
            sVar36 = -(uVar7 >> (bVar32 & 0x1f));
          }
          else {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
          }
          (*paaVar43)[0] = sVar36 + uVar7;
          pFVar49->zeromv_cdf[uVar27][2] = uVar25 + (uVar25 < 0x20);
        }
        if (iVar28 == 0) {
          bVar32 = 0xf;
        }
        else {
          uVar27 = (uint)(local_1e0 >> 4) & 0xf;
          paaVar43 = local_228->refmv_cdf + uVar27;
          iVar28 = od_ec_decode_cdf_q15((od_ec_dec *)local_250,*paaVar43,2);
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->refmv_cdf[uVar27][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*paaVar43)[0];
            if ((char)iVar28 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*paaVar43)[0] = sVar36 + uVar7;
            pFVar12->refmv_cdf[uVar27][2] = uVar25 + (uVar25 < 0x20);
          }
          bVar32 = 0xe - (iVar28 == 0);
        }
      }
    }
    else {
      pFVar12 = (dcb->xd).tile_ctx;
      icdf_01 = pFVar12->inter_compound_mode_cdf + uVar39;
      iVar28 = od_ec_decode_cdf_q15((od_ec_dec *)local_250,*icdf_01,8);
      if (r->allow_update_cdf != '\0') {
        uVar25 = pFVar12->inter_compound_mode_cdf[uVar39][8];
        bVar32 = (char)(uVar25 >> 4) + 5;
        lVar37 = 0;
        do {
          uVar7 = (*icdf_01)[lVar37];
          if (lVar37 < (char)iVar28) {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
          }
          else {
            sVar36 = -(uVar7 >> (bVar32 & 0x1f));
          }
          (*icdf_01)[lVar37] = sVar36 + uVar7;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 7);
        paVar3 = pFVar12->inter_compound_mode_cdf[uVar39] + 8;
        *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
      }
      bVar32 = (char)iVar28 + 0x11;
    }
    pFVar12 = local_228;
    pMVar9->mode = bVar32;
    if ((bVar32 < 0x19) && ((0x1654000U >> (bVar32 & 0x1f) & 1) != 0)) {
      bVar35 = pMVar9->ref_frame[0];
      cVar21 = pMVar9->ref_frame[1];
      if ('\0' < cVar21) {
        cVar47 = -1;
        if (cVar21 < '\x05' || '\x04' < (char)bVar35) {
          lVar37 = 0;
          do {
            if ((bVar35 == (&comp_ref0_lut)[lVar37]) && (cVar21 == (&comp_ref1_lut)[lVar37])) {
              cVar47 = (char)lVar37;
              break;
            }
            lVar37 = lVar37 + 1;
          } while (lVar37 != 9);
        }
        if (cVar47 < '\0') {
          bVar35 = (cVar21 * '\x04' + bVar35) - 0xd;
        }
        else {
          bVar35 = cVar47 + 0x14;
        }
      }
      pMVar9->field_0xa7 = pMVar9->field_0xa7 & 0xcf;
      pFVar49 = local_250;
      if ((bVar32 | 8) == 0x18) {
        local_240 = (od_ec_dec *)(&local_240->buf + (ulong)bVar35 * 2);
        uVar39 = 0;
        do {
          uVar53 = uVar39 + 1;
          if (uVar53 < *(uint8_t *)((long)local_230 + (ulong)bVar35)) {
            bVar55 = *(ushort *)((long)&local_240->buf + uVar39 * 2 + 2) < 0x280;
            uVar31 = (ulong)bVar55;
            if (*(aom_cdf_prob *)((long)&local_240->buf + uVar39 * 2) < 0x280) {
              uVar31 = (ulong)((uint)bVar55 * 2);
            }
            paaVar43 = pFVar12->drl_cdf + uVar31;
            iVar28 = od_ec_decode_cdf_q15((od_ec_dec *)pFVar49,*paaVar43,2);
            if (r->allow_update_cdf != '\0') {
              uVar25 = (*paaVar43)[2];
              bVar32 = (char)(uVar25 >> 4) + 4;
              uVar7 = (*paaVar43)[0];
              if ((char)iVar28 < '\x01') {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              (*paaVar43)[0] = sVar36 + uVar7;
              (*paaVar43)[2] = uVar25 + (uVar25 < 0x20);
            }
            *(ushort *)&pMVar9->field_0xa7 =
                 *(ushort *)&pMVar9->field_0xa7 & 0xffcf |
                 (ushort)(((int)uVar39 + iVar28 & 3U) << 4);
            pFVar49 = local_250;
            if (iVar28 == 0) goto LAB_00180b97;
          }
          uVar39 = uVar53;
        } while (uVar53 == 1);
      }
      if ((pMVar9->mode < 0x17) && ((0x644000U >> (pMVar9->mode & 0x1f) & 1) != 0)) {
        local_240 = (od_ec_dec *)local_228->drl_cdf;
        puVar38 = (local_220->xd).weight[bVar35] + 2;
        uVar53 = 1;
        uVar39 = 2;
        do {
          if (uVar39 < *(uint8_t *)((long)local_230 + (ulong)bVar35)) {
            uVar31 = (ulong)(*puVar38 < 0x280);
            if (puVar38[-1] < 0x280) {
              uVar31 = (ulong)((uint)(*puVar38 < 0x280) * 2);
            }
            paVar3 = (aom_cdf_prob *)((long)&local_240->buf + uVar31 * 6);
            iVar28 = od_ec_decode_cdf_q15((od_ec_dec *)pFVar49,paVar3,2);
            if (r->allow_update_cdf != '\0') {
              uVar25 = paVar3[2];
              bVar32 = (char)(uVar25 >> 4) + 4;
              uVar7 = *paVar3;
              if ((char)iVar28 < '\x01') {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              *paVar3 = sVar36 + uVar7;
              paVar3[2] = uVar25 + (uVar25 < 0x20);
            }
            *(ushort *)&pMVar9->field_0xa7 =
                 *(ushort *)&pMVar9->field_0xa7 & 0xffcf |
                 ((short)iVar28 + (short)uVar53) * 0x10 + 0x30U & 0x30;
            if ((1 < uVar53) || (pFVar49 = local_250, iVar28 == 0)) break;
          }
          else if (1 < uVar53) break;
          puVar38 = puVar38 + 1;
          uVar39 = uVar39 + 1;
          uVar53 = uVar53 + 1;
        } while( true );
      }
    }
  }
  else {
    pMVar9->mode = PVar34;
  }
LAB_00180b97:
  pDVar46 = local_220;
  if ((byte)(pMVar9->mode - 0x19) < 0xf8 == '\0' < (char)local_1f8) {
    aom_internal_error((local_220->xd).error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Prediction mode %d invalid with ref frame %d %d",(ulong)pMVar9->mode,
                       (ulong)(uint)(int)pMVar9->ref_frame[0],(ulong)(uint)(int)pMVar9->ref_frame[1]
                      );
  }
  pnVar15 = local_1f0;
  pAVar54 = local_238;
  iVar28 = (int)local_1e8;
  if ((char)local_1f8 < '\x01') {
    if (pMVar9->mode != '\x0f') {
      av1_find_best_ref_mvs
                ((int)local_1e8,ref_mvs[pMVar9->ref_frame[0]],(int_mv *)&local_258,
                 (int_mv *)&local_260,(uint)(local_238->common).features.cur_frame_force_integer_mv)
      ;
    }
LAB_00180cb7:
    uVar25 = *(ushort *)&pMVar9->field_0xa7 >> 4;
    cVar21 = (char)local_20c;
    if (((uVar25 & 3) != 0) && (pMVar9->mode == '\x0e')) {
      local_260 = CONCAT44(local_260._4_4_,
                           *(undefined4 *)
                            (pnVar15->classes_cdf +
                            ((long)pMVar9->ref_frame[0] * 8 + (ulong)(uVar25 & 3) + 1) * 4));
    }
  }
  else {
    if (pMVar9->mode == '\x17') goto LAB_00180cb7;
    uVar39 = *(ulong *)(local_1f0->classes_cdf + (long)(char)local_20c * 0x20);
    uVar53 = *(ulong *)((long)local_1f0->classes_cdf +
                       (ulong)(*(ushort *)&pMVar9->field_0xa7 >> 1 & 0x18) +
                       ((long)(char)local_20c * 8 + 1) * 8);
    bVar55 = (local_238->common).features.cur_frame_force_integer_mv;
    local_258._0_2_ = (undefined2)uVar39;
    local_258._2_6_ = (undefined6)(uVar39 >> 0x10);
    if (bVar55 == false) {
      if ((int)local_1e8 == 0) {
        if ((uVar39 & 1) != 0) {
          local_258 = CONCAT62(local_258._2_6_,
                               (undefined2)local_258 +
                               (ushort)((short)(undefined2)local_258 < 1) * 2 + -1);
          uVar39 = local_258;
        }
        local_258 = uVar39;
        uVar39 = local_258;
        if ((local_258 & 0x10000) != 0) {
          local_258._0_4_ =
               (int_mv)CONCAT22(local_258._2_2_ + (ushort)((short)local_258._2_2_ < 1) * 2 + -1,
                                (undefined2)local_258);
          uVar39 = local_258;
        }
      }
    }
    else {
      uVar27 = (int)(short)(undefined2)local_258 % 8;
      if (uVar27 != 0) {
        sVar36 = (undefined2)local_258 - (short)uVar27;
        local_258 = CONCAT62(local_258._2_6_,sVar36);
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        uVar39 = local_258;
        if (4 < uVar26) {
          if ((int)uVar27 < 1) {
            sVar36 = sVar36 + -8;
          }
          else {
            sVar36 = sVar36 + 8;
          }
          local_258 = CONCAT62(local_258._2_6_,sVar36);
          uVar39 = local_258;
        }
      }
      local_258 = uVar39;
      uVar27 = (int)(short)local_258._2_2_ % 8;
      uVar39 = local_258;
      if (uVar27 != 0) {
        sVar36 = local_258._2_2_ - (short)uVar27;
        local_258._0_4_ = (int_mv)CONCAT22(sVar36,(undefined2)local_258);
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        uVar39 = local_258;
        if (4 < uVar26) {
          if ((int)uVar27 < 1) {
            sVar36 = sVar36 + -8;
          }
          else {
            sVar36 = sVar36 + 8;
          }
          local_258._0_4_ = (int_mv)CONCAT22(sVar36,(undefined2)local_258);
          uVar39 = local_258;
        }
      }
    }
    local_258 = uVar39;
    if (bVar55 == false) {
      if ((int)local_1e8 == 0) {
        if ((local_258 & 0x100000000) != 0) {
          local_258._0_6_ =
               CONCAT24(local_258._4_2_ + (ushort)(local_258._4_2_ < 1) * 2 + -1,local_258._0_4_);
        }
        if ((local_258 & 0x1000000000000) != 0) {
          local_258 = CONCAT26(local_258._6_2_ + (ushort)(local_258._6_2_ < 1) * 2 + -1,
                               (undefined6)local_258);
        }
      }
    }
    else {
      uVar27 = (int)local_258._4_2_ % 8;
      if (uVar27 != 0) {
        local_258._4_2_ = local_258._4_2_ - (short)uVar27;
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        if (4 < uVar26) {
          local_258._0_6_ =
               CONCAT24(local_258._4_2_ + (ushort)(0 < (int)uVar27) * 0x10 + -8,local_258._0_4_);
        }
      }
      uVar27 = (int)local_258._6_2_ % 8;
      if (uVar27 != 0) {
        sVar36 = local_258._6_2_ - (short)uVar27;
        local_258 = CONCAT26(sVar36,(undefined6)local_258);
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        if (4 < uVar26) {
          if ((int)uVar27 < 1) {
            sVar36 = sVar36 + -8;
          }
          else {
            sVar36 = sVar36 + 8;
          }
          local_258 = CONCAT26(sVar36,(undefined6)local_258);
        }
      }
    }
    local_260._0_2_ = (undefined2)uVar53;
    local_260._2_6_ = (undefined6)(uVar53 >> 0x10);
    if (bVar55 == false) {
      if ((int)local_1e8 == 0) {
        if ((uVar53 & 1) != 0) {
          local_260 = CONCAT62(local_260._2_6_,
                               (undefined2)local_260 +
                               (ushort)((short)(undefined2)local_260 < 1) * 2 + -1);
          uVar53 = local_260;
        }
        local_260 = uVar53;
        uVar53 = local_260;
        if ((local_260 & 0x10000) != 0) {
          local_260._0_4_ =
               (int_mv)CONCAT22(local_260._2_2_ + (ushort)((short)local_260._2_2_ < 1) * 2 + -1,
                                (undefined2)local_260);
          uVar53 = local_260;
        }
      }
    }
    else {
      uVar27 = (int)(short)(undefined2)local_260 % 8;
      if (uVar27 != 0) {
        sVar36 = (undefined2)local_260 - (short)uVar27;
        local_260 = CONCAT62(local_260._2_6_,sVar36);
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        uVar53 = local_260;
        if (4 < uVar26) {
          if ((int)uVar27 < 1) {
            sVar36 = sVar36 + -8;
          }
          else {
            sVar36 = sVar36 + 8;
          }
          local_260 = CONCAT62(local_260._2_6_,sVar36);
          uVar53 = local_260;
        }
      }
      local_260 = uVar53;
      uVar27 = (int)(short)local_260._2_2_ % 8;
      uVar53 = local_260;
      if (uVar27 != 0) {
        sVar36 = local_260._2_2_ - (short)uVar27;
        local_260._0_4_ = (int_mv)CONCAT22(sVar36,(undefined2)local_260);
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        uVar53 = local_260;
        if (4 < uVar26) {
          if ((int)uVar27 < 1) {
            sVar36 = sVar36 + -8;
          }
          else {
            sVar36 = sVar36 + 8;
          }
          local_260._0_4_ = (int_mv)CONCAT22(sVar36,(undefined2)local_260);
          uVar53 = local_260;
        }
      }
    }
    local_260 = uVar53;
    cVar21 = (char)local_20c;
    if (bVar55 == false) {
      if ((int)local_1e8 == 0) {
        if ((local_260 & 0x100000000) != 0) {
          local_260._0_6_ =
               CONCAT24(local_260._4_2_ + (ushort)(local_260._4_2_ < 1) * 2 + -1,local_260._0_4_);
        }
        if ((local_260 & 0x1000000000000) != 0) {
          local_260 = CONCAT26(local_260._6_2_ + (ushort)(local_260._6_2_ < 1) * 2 + -1,
                               (undefined6)local_260);
        }
      }
    }
    else {
      uVar27 = (int)local_260._4_2_ % 8;
      if (uVar27 != 0) {
        local_260._4_2_ = local_260._4_2_ - (short)uVar27;
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        if (4 < uVar26) {
          local_260._0_6_ =
               CONCAT24(local_260._4_2_ + (ushort)(0 < (int)uVar27) * 0x10 + -8,local_260._0_4_);
        }
      }
      uVar27 = (int)local_260._6_2_ % 8;
      if (uVar27 != 0) {
        sVar36 = local_260._6_2_ - (short)uVar27;
        local_260 = CONCAT26(sVar36,(undefined6)local_260);
        uVar26 = -uVar27;
        if (0 < (int)uVar27) {
          uVar26 = uVar27;
        }
        if (4 < uVar26) {
          if ((int)uVar27 < 1) {
            sVar36 = sVar36 + -8;
          }
          else {
            sVar36 = sVar36 + 8;
          }
          local_260 = CONCAT26(sVar36,(undefined6)local_260);
        }
      }
    }
  }
  local_208.as_int = local_258._0_4_;
  local_204 = local_258._4_4_;
  bVar32 = pMVar9->mode;
  if ((char)local_1f8 < '\x01') {
    if ((bVar32 == 0x10) && (1 < *(uint8_t *)((long)local_230 + (long)cVar21))) {
      local_208 = (int_mv)*(int_mv *)
                           &((int_mv *)
                            ((long)pnVar15->classes_cdf +
                            (ulong)(*(ushort *)&pMVar9->field_0xa7 >> 1 & 0x18) +
                            (long)cVar21 * 0x40))->as_mv;
    }
  }
  else {
    if ((bVar32 == 0x15) || (bVar32 == 0x16)) {
      uVar27 = (*(ushort *)&pMVar9->field_0xa7 >> 4 & 3) + 1;
    }
    else {
      uVar27 = *(ushort *)&pMVar9->field_0xa7 >> 4 & 3;
    }
    if ((0x1510000UL >> ((ulong)bVar32 & 0x3f) & 1) != 0) {
      local_208 = *(int_mv *)(pnVar15->classes_cdf + ((long)cVar21 * 8 + (ulong)uVar27) * 4);
    }
    if ((0x1280000UL >> ((ulong)bVar32 & 0x3f) & 1) != 0) {
      local_204 = *(uint32_t *)(pnVar15->classes_cdf + ((long)cVar21 * 8 + (ulong)uVar27) * 4 + 2);
    }
  }
  local_230 = pMVar9->mv;
  bVar55 = (pAVar54->common).features.cur_frame_force_integer_mv;
  if (bVar55 != false) {
    iVar28 = -1;
  }
  if (0xb < pMVar9->mode - 0xd) {
    uVar27 = 0;
    goto LAB_00181d19;
  }
  pFVar12 = (pDVar46->xd).tile_ctx;
  BVar6 = (*(pDVar46->xd).mi)->bsize;
  uVar27 = (uint)bVar55;
  iVar29.as_int = local_258._0_4_;
  local_250 = pFVar12;
  switch((uint)pMVar9->mode) {
  case 0xd:
    goto switchD_00181588_caseD_d;
  case 0xe:
    iVar29.as_int = local_260._0_4_;
    goto switchD_00181588_caseD_d;
  case 0xf:
    iVar29 = gm_get_motion_vector
                       ((pAVar54->common).global_motion + pMVar9->ref_frame[0],
                        (uint)(pAVar54->common).features.allow_high_precision_mv,BVar6,
                        (pDVar46->xd).mi_col,(pDVar46->xd).mi_row,uVar27);
    pMVar9->mv[0] = iVar29;
    break;
  case 0x10:
    local_240 = (od_ec_dec *)CONCAT44(local_240._4_4_,(uint)bVar55);
    pnVar4 = &pFVar12->nmvc;
    iVar30 = od_ec_decode_cdf_q15(&r->ec,pnVar4->joints_cdf,4);
    bVar32 = (byte)iVar30;
    if (r->allow_update_cdf != '\0') {
      uVar25 = (pFVar12->nmvc).joints_cdf[4];
      bVar35 = (char)(uVar25 >> 4) + 5;
      lVar37 = 0;
      do {
        uVar7 = pnVar4->joints_cdf[lVar37];
        if (lVar37 < (char)bVar32) {
          sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
        }
        else {
          sVar36 = -(uVar7 >> (bVar35 & 0x1f));
        }
        pnVar4->joints_cdf[lVar37] = sVar36 + uVar7;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 3);
      paVar3 = (local_250->nmvc).joints_cdf + 4;
      *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
    }
    if ((bVar32 & 0xfe) == 2) {
      iVar30 = read_mv_component(r,(local_250->nmvc).comps,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar36 = (short)iVar30;
    }
    else {
      sVar36 = 0;
    }
    if ((bVar32 & 0xfd) == 1) {
      iVar28 = read_mv_component(r,(local_250->nmvc).comps + 1,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar24 = (short)iVar28;
    }
    else {
      sVar24 = 0;
    }
    iVar58._0_2_ = sVar36 + local_208.as_mv.row;
    iVar58._2_2_ = sVar24 + local_208.as_mv.col;
    *local_230 = iVar58;
    break;
  case 0x11:
    pMVar9->mv[0].as_int = (uint32_t)local_258._0_4_;
    pMVar9->mv[1].as_int = (uint32_t)local_258._4_4_;
    break;
  case 0x12:
    *(ulong *)local_230 = local_260;
    break;
  case 0x13:
    local_240 = (od_ec_dec *)CONCAT44(local_240._4_4_,(uint)bVar55);
    pnVar4 = &pFVar12->nmvc;
    local_230->as_int = (uint32_t)local_258._0_4_;
    iVar30 = od_ec_decode_cdf_q15(&r->ec,pnVar4->joints_cdf,4);
    bVar32 = (byte)iVar30;
    if (r->allow_update_cdf != '\0') {
      uVar25 = (pFVar12->nmvc).joints_cdf[4];
      bVar35 = (char)(uVar25 >> 4) + 5;
      lVar37 = 0;
      do {
        uVar7 = pnVar4->joints_cdf[lVar37];
        if (lVar37 < (char)bVar32) {
          sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
        }
        else {
          sVar36 = -(uVar7 >> (bVar35 & 0x1f));
        }
        pnVar4->joints_cdf[lVar37] = sVar36 + uVar7;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 3);
LAB_00181af7:
      paVar3 = (local_250->nmvc).joints_cdf + 4;
      *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
    }
    goto LAB_00181b08;
  case 0x14:
    local_240 = (od_ec_dec *)CONCAT44(local_240._4_4_,uVar27);
    pnVar4 = &pFVar12->nmvc;
    iVar30 = od_ec_decode_cdf_q15(&r->ec,pnVar4->joints_cdf,4);
    bVar32 = (byte)iVar30;
    if (r->allow_update_cdf != '\0') {
      uVar25 = (pFVar12->nmvc).joints_cdf[4];
      bVar35 = (char)(uVar25 >> 4) + 5;
      lVar37 = 0;
      do {
        uVar7 = pnVar4->joints_cdf[lVar37];
        if (lVar37 < (char)bVar32) {
          sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
        }
        else {
          sVar36 = -(uVar7 >> (bVar35 & 0x1f));
        }
        pnVar4->joints_cdf[lVar37] = sVar36 + uVar7;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 3);
      paVar3 = (local_250->nmvc).joints_cdf + 4;
      *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
    }
    if ((bVar32 & 0xfe) == 2) {
      iVar30 = read_mv_component(r,(local_250->nmvc).comps,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar36 = (short)iVar30;
    }
    else {
      sVar36 = 0;
    }
    if ((bVar32 & 0xfd) == 1) {
      iVar28 = read_mv_component(r,(local_250->nmvc).comps + 1,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar24 = (short)iVar28;
    }
    else {
      sVar24 = 0;
    }
    iVar59._0_2_ = sVar36 + local_208.as_mv.row;
    iVar59._2_2_ = sVar24 + local_208.as_mv.col;
    pMVar9->mv[0] = iVar59;
    iVar29.as_int = local_258._4_4_;
    goto LAB_00181c90;
  case 0x15:
    local_240 = (od_ec_dec *)CONCAT44(local_240._4_4_,uVar27);
    pnVar4 = &pFVar12->nmvc;
    local_230->as_int = (uint32_t)local_260._0_4_;
    iVar30 = od_ec_decode_cdf_q15(&r->ec,pnVar4->joints_cdf,4);
    bVar32 = (byte)iVar30;
    if (r->allow_update_cdf != '\0') {
      uVar25 = (pFVar12->nmvc).joints_cdf[4];
      bVar35 = (char)(uVar25 >> 4) + 5;
      lVar37 = 0;
      do {
        uVar7 = pnVar4->joints_cdf[lVar37];
        if (lVar37 < (char)bVar32) {
          sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
        }
        else {
          sVar36 = -(uVar7 >> (bVar35 & 0x1f));
        }
        pnVar4->joints_cdf[lVar37] = sVar36 + uVar7;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 3);
      goto LAB_00181af7;
    }
LAB_00181b08:
    if ((bVar32 & 0xfe) == 2) {
      iVar30 = read_mv_component(r,(local_250->nmvc).comps,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar36 = (short)iVar30;
    }
    else {
      sVar36 = 0;
    }
    if ((bVar32 & 0xfd) == 1) {
      iVar28 = read_mv_component(r,(local_250->nmvc).comps + 1,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar24 = (short)iVar28;
    }
    else {
      sVar24 = 0;
    }
    iVar56._0_2_ = sVar36 + (short)local_204;
    iVar56._2_2_ = sVar24 + (short)(local_204 >> 0x10);
    pMVar9->mv[1] = iVar56;
    break;
  case 0x16:
    local_240 = (od_ec_dec *)CONCAT44(local_240._4_4_,uVar27);
    pnVar4 = &pFVar12->nmvc;
    iVar30 = od_ec_decode_cdf_q15(&r->ec,pnVar4->joints_cdf,4);
    bVar32 = (byte)iVar30;
    if (r->allow_update_cdf != '\0') {
      uVar25 = (pFVar12->nmvc).joints_cdf[4];
      bVar35 = (char)(uVar25 >> 4) + 5;
      lVar37 = 0;
      do {
        uVar7 = pnVar4->joints_cdf[lVar37];
        if (lVar37 < (char)bVar32) {
          sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
        }
        else {
          sVar36 = -(uVar7 >> (bVar35 & 0x1f));
        }
        pnVar4->joints_cdf[lVar37] = sVar36 + uVar7;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 3);
      paVar3 = (local_250->nmvc).joints_cdf + 4;
      *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
    }
    if ((bVar32 & 0xfe) == 2) {
      iVar30 = read_mv_component(r,(local_250->nmvc).comps,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar36 = (short)iVar30;
    }
    else {
      sVar36 = 0;
    }
    if ((bVar32 & 0xfd) == 1) {
      iVar28 = read_mv_component(r,(local_250->nmvc).comps + 1,(uint)(byte)((byte)local_240 ^ 1),
                                 (uint)(0 < iVar28));
      sVar24 = (short)iVar28;
    }
    else {
      sVar24 = 0;
    }
    iVar57._0_2_ = sVar36 + local_208.as_mv.row;
    iVar57._2_2_ = sVar24 + local_208.as_mv.col;
    pMVar9->mv[0] = iVar57;
    iVar29.as_int = local_260._4_4_;
    goto LAB_00181c90;
  case 0x17:
    iVar29 = gm_get_motion_vector
                       ((pAVar54->common).global_motion + pMVar9->ref_frame[0],
                        (uint)(pAVar54->common).features.allow_high_precision_mv,BVar6,
                        (pDVar46->xd).mi_col,(pDVar46->xd).mi_row,uVar27);
    pMVar9->mv[0] = iVar29;
    iVar29 = gm_get_motion_vector
                       ((pAVar54->common).global_motion + pMVar9->ref_frame[1],
                        (uint)(pAVar54->common).features.allow_high_precision_mv,BVar6,
                        (pDVar46->xd).mi_col,(pDVar46->xd).mi_row,
                        (uint)(pAVar54->common).features.cur_frame_force_integer_mv);
LAB_00181c90:
    pMVar9->mv[1] = iVar29;
    break;
  case 0x18:
    pnVar4 = &pFVar12->nmvc;
    local_240 = &r->ec;
    local_1e8 = (pFVar12->nmvc).comps;
    local_20c = (uint)(bVar55 ^ 1);
    local_1f0 = (pFVar12->nmvc).comps + 1;
    lVar37 = 0;
    do {
      pFVar12 = local_250;
      iVar30 = od_ec_decode_cdf_q15(local_240,pnVar4->joints_cdf,4);
      bVar32 = (byte)iVar30;
      if (r->allow_update_cdf != '\0') {
        uVar25 = (pFVar12->nmvc).joints_cdf[4];
        bVar35 = (char)(uVar25 >> 4) + 5;
        lVar51 = 0;
        do {
          uVar7 = pnVar4->joints_cdf[lVar51];
          if (lVar51 < (char)bVar32) {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
          }
          else {
            sVar36 = -(uVar7 >> (bVar35 & 0x1f));
          }
          pnVar4->joints_cdf[lVar51] = sVar36 + uVar7;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 3);
        paVar3 = (pFVar12->nmvc).joints_cdf + 4;
        *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
      }
      if ((bVar32 & 0xfe) == 2) {
        iVar30 = read_mv_component(r,local_1e8,local_20c,(uint)(0 < iVar28));
        sVar36 = (short)iVar30;
      }
      else {
        sVar36 = 0;
      }
      if ((bVar32 & 0xfd) == 1) {
        iVar30 = read_mv_component(r,local_1f0,local_20c,(uint)(0 < iVar28));
        sVar24 = (short)iVar30;
      }
      else {
        sVar24 = 0;
      }
      iVar29._0_2_ = sVar36 + (&local_208)[lVar37].as_mv.row;
      iVar29._2_2_ = sVar24 + (&local_208)[lVar37].as_mv.col;
      local_230[lVar37] = iVar29;
      bVar55 = lVar37 == 0;
      lVar37 = lVar37 + 1;
    } while (bVar55);
  }
LAB_00181c94:
  uVar27 = 0;
  if (((ushort)((local_230->as_mv).row + 0x3fffU) < 0x7fff) &&
     (sVar36 = pMVar9->mv[0].as_mv.col, -0x4000 < sVar36)) {
    uVar27 = (uint)(sVar36 < 0x4000);
  }
  pDVar46 = local_220;
  pAVar54 = local_238;
  if (((('\0' < (char)local_1f8) && (uVar26 = 0, bVar55 = uVar27 != 0, uVar27 = uVar26, bVar55)) &&
      ((ushort)(pMVar9->mv[1].as_mv.row + 0x3fffU) < 0x7fff)) &&
     (sVar36 = *(short *)((long)pMVar9->mv + 6), -0x4000 < sVar36)) {
    uVar27 = (uint)(sVar36 < 0x4000);
  }
LAB_00181d19:
  aom_merge_corrupted_flag(&pDVar46->corrupted,uVar27 ^ 1);
  uVar25 = *(ushort *)&pMVar9->field_0xa7;
  *(ushort *)&pMVar9->field_0xa7 = uVar25 & 0xfbff;
  if ((((((pAVar54->common).seq_params)->enable_interintra_compound != '\0') &&
       ((uVar25 & 0x40) == 0)) &&
      ((0xf8 < (byte)(pMVar9->bsize - BLOCK_32X64) &&
       ((0xfb < (byte)(pMVar9->mode - 0x11) && ('\0' < pMVar9->ref_frame[0])))))) &&
     (pMVar9->ref_frame[1] < '\x01')) {
    bVar32 = ""[local_218];
    paaVar43 = local_228->interintra_cdf + bVar32;
    poVar1 = &r->ec;
    iVar28 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
    if (r->allow_update_cdf != '\0') {
      uVar25 = (*paaVar43)[2];
      bVar35 = (char)(uVar25 >> 4) + 4;
      uVar7 = (*paaVar43)[0];
      if ((char)iVar28 < '\x01') {
        sVar36 = -(uVar7 >> (bVar35 & 0x1f));
      }
      else {
        sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
      }
      (*paaVar43)[0] = sVar36 + uVar7;
      (*paaVar43)[2] = uVar25 + (uVar25 < 0x20);
    }
    if (iVar28 != 0) {
      pFVar12 = (pDVar46->xd).tile_ctx;
      icdf_02 = pFVar12->interintra_mode_cdf + bVar32;
      iVar28 = od_ec_decode_cdf_q15(poVar1,*icdf_02,4);
      uVar39 = local_218;
      pFVar49 = local_228;
      if (r->allow_update_cdf != '\0') {
        uVar25 = pFVar12->interintra_mode_cdf[bVar32][4];
        bVar35 = (char)(uVar25 >> 4) + 5;
        lVar37 = 0;
        do {
          uVar7 = (*icdf_02)[lVar37];
          if (lVar37 < (char)(INTERINTRA_MODE)iVar28) {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
          }
          else {
            sVar36 = -(uVar7 >> (bVar35 & 0x1f));
          }
          (*icdf_02)[lVar37] = sVar36 + uVar7;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 3);
        paVar3 = pFVar12->interintra_mode_cdf[bVar32] + 4;
        *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
      }
      pMVar9->ref_frame[1] = '\0';
      pMVar9->interintra_mode = (INTERINTRA_MODE)iVar28;
      pMVar9->angle_delta[0] = '\0';
      pMVar9->angle_delta[1] = '\0';
      (pMVar9->filter_intra_mode_info).use_filter_intra = '\0';
      if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                      (ulong)(uint)((int)local_218 << 5))) {
        paaVar43 = local_228->wedge_interintra_cdf + local_218;
        uVar27 = od_ec_decode_cdf_q15(poVar1,*paaVar43,2);
        pFVar12 = local_228;
        if (r->allow_update_cdf != '\0') {
          uVar25 = pFVar49->wedge_interintra_cdf[uVar39][2];
          bVar32 = (char)(uVar25 >> 4) + 4;
          uVar7 = (*paaVar43)[0];
          if ((char)uVar27 < '\x01') {
            sVar36 = -(uVar7 >> (bVar32 & 0x1f));
          }
          else {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
          }
          (*paaVar43)[0] = sVar36 + uVar7;
          pFVar49->wedge_interintra_cdf[uVar39][2] = uVar25 + (uVar25 < 0x20);
        }
        *(ushort *)&pMVar9->field_0xa7 =
             *(ushort *)&pMVar9->field_0xa7 & 0xfbff | (ushort)((uVar27 & 1) << 10);
        if ((uVar27 & 1) != 0) {
          lVar37 = (ulong)(uint)((int)local_218 << 5) + local_218 * 2;
          puVar38 = (uint16_t *)((long)local_228->wedge_idx_cdf[0] + lVar37);
          iVar28 = od_ec_decode_cdf_q15(poVar1,puVar38,0x10);
          if (r->allow_update_cdf != '\0') {
            uVar25 = *(ushort *)((long)pFVar12->wedge_idx_cdf[0] + lVar37 + 0x20);
            bVar32 = (char)(uVar25 >> 4) + 5;
            lVar51 = 0;
            do {
              uVar7 = puVar38[lVar51];
              if (lVar51 < (char)iVar28) {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              puVar38[lVar51] = sVar36 + uVar7;
              lVar51 = lVar51 + 1;
            } while (lVar51 != 0xf);
            psVar2 = (short *)((long)pFVar12->wedge_idx_cdf[0] + lVar37 + 0x20);
            *psVar2 = *psVar2 + (ushort)(uVar25 < 0x20);
          }
          pMVar9->interintra_wedge_index = (char)iVar28;
        }
      }
    }
  }
  lVar37 = 0;
  do {
    iVar28 = -1;
    if ((byte)(pMVar9->ref_frame[lVar37] - 1U) < 8) {
      iVar28 = (local_238->common).remapped_ref_idx[(byte)pMVar9->ref_frame[lVar37] - 1];
    }
    psVar42 = (scale_factors *)0x0;
    if (iVar28 != -1) {
      psVar42 = (local_238->common).ref_scale_factors + iVar28;
    }
    (pDVar46->xd).block_ref_scale_factors[lVar37] = psVar42;
    cVar21 = pMVar9->ref_frame[1];
  } while ((lVar37 == 0) && (lVar37 = 1, '\0' < cVar21));
  pMVar9->motion_mode = '\0';
  bVar32 = block_size_high[pMVar9->bsize];
  if (block_size_wide[pMVar9->bsize] < block_size_high[pMVar9->bsize]) {
    bVar32 = block_size_wide[pMVar9->bsize];
  }
  if (((7 < bVar32) && (cVar21 < '\x01')) && ((*(ushort *)&pMVar9->field_0xa7 & 0x40) == 0)) {
    uVar18 = av1_findSamples(local_200,&pDVar46->xd,pts,pts_inref);
    pMVar9->num_proj_ref = uVar18;
  }
  av1_count_overlappable_neighbors(local_200,&pDVar46->xd);
  if (pMVar9->ref_frame[1] != '\0') {
    if (((local_238->common).features.switchable_motion_mode == false) ||
       ((pMVar9->field_0xa7 & 0x40) != 0)) {
      MVar22 = '\0';
    }
    else {
      if (pMVar9->overlappable_neighbors == '\0') {
LAB_00181f55:
        MVar22 = '\0';
      }
      else {
        iVar28 = (pDVar46->xd).cur_frame_force_integer_mv;
        if (iVar28 == 0) {
          bVar32 = block_size_high[pMVar9->bsize];
          if (block_size_wide[pMVar9->bsize] < block_size_high[pMVar9->bsize]) {
            bVar32 = block_size_wide[pMVar9->bsize];
          }
          if (((1 < (pDVar46->xd).global_motion[pMVar9->ref_frame[0]].wmtype) &&
              ((pMVar9->mode - 0xf & 0xf7) == 0)) && (7 < bVar32)) goto LAB_00181f55;
        }
        bVar32 = block_size_high[pMVar9->bsize];
        if (block_size_wide[pMVar9->bsize] < block_size_high[pMVar9->bsize]) {
          bVar32 = block_size_wide[pMVar9->bsize];
        }
        if (bVar32 < 8) goto LAB_00181f55;
        MVar22 = '\0';
        if ((pMVar9->ref_frame[1] < '\0') && (MVar22 = '\0', 0xf3 < (byte)(pMVar9->mode - 0x19))) {
          if ((iVar28 == 0) &&
             (((local_238->common).features.allow_warped_motion != false &&
              (pMVar9->num_proj_ref != '\0')))) {
            psVar42 = (pDVar46->xd).block_ref_scale_factors[0];
            iVar28 = psVar42->x_scale_fp;
            MVar22 = '\x02';
            if ((iVar28 == -1) ||
               ((iVar30 = psVar42->y_scale_fp, iVar30 == -1 ||
                (iVar30 == 0x4000 && iVar28 == 0x4000)))) goto LAB_00181f57;
          }
          MVar22 = '\x01';
        }
      }
LAB_00181f57:
      if (MVar22 != '\0') {
        if (MVar22 == '\x01') {
          pFVar12 = (pDVar46->xd).tile_ctx;
          BVar6 = pMVar9->bsize;
          paaVar43 = pFVar12->obmc_cdf + BVar6;
          iVar28 = od_ec_decode_cdf_q15(&r->ec,*paaVar43,2);
          MVar22 = (MOTION_MODE)iVar28;
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->obmc_cdf[BVar6][2];
            bVar32 = (char)(uVar25 >> 4) + 4;
            uVar7 = (*paaVar43)[0];
            if ((char)MVar22 < '\x01') {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            (*paaVar43)[0] = sVar36 + uVar7;
            pFVar12->obmc_cdf[BVar6][2] = uVar25 + (uVar25 < 0x20);
          }
        }
        else {
          pFVar12 = (pDVar46->xd).tile_ctx;
          BVar6 = pMVar9->bsize;
          paaVar45 = pFVar12->motion_mode_cdf + BVar6;
          iVar28 = od_ec_decode_cdf_q15(&r->ec,*paaVar45,3);
          MVar22 = (MOTION_MODE)iVar28;
          if (r->allow_update_cdf != '\0') {
            uVar25 = pFVar12->motion_mode_cdf[BVar6][3];
            bVar32 = (char)(uVar25 >> 4) + 4;
            lVar37 = 0;
            do {
              uVar7 = (*paaVar45)[lVar37];
              if (lVar37 < (char)MVar22) {
                sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
              }
              else {
                sVar36 = -(uVar7 >> (bVar32 & 0x1f));
              }
              (*paaVar45)[lVar37] = sVar36 + uVar7;
              lVar37 = lVar37 + 1;
            } while (lVar37 != 2);
            paVar3 = pFVar12->motion_mode_cdf[BVar6] + 3;
            *paVar3 = *paVar3 + (ushort)(uVar25 < 0x20);
          }
        }
      }
    }
    pMVar9->motion_mode = MVar22;
  }
  pAVar54 = local_238;
  uVar25 = *(ushort *)&pMVar9->field_0xa7;
  *(ushort *)&pMVar9->field_0xa7 = uVar25 & 0xfcff | 0x200;
  (pMVar9->interinter_comp).type = '\0';
  if ((uVar25 & 0x40) == 0 && '\0' < pMVar9->ref_frame[1]) {
    bVar32 = block_size_high[local_218];
    if (block_size_wide[local_218] < block_size_high[local_218]) {
      bVar32 = block_size_wide[local_218];
    }
    if (7 < bVar32) {
      uVar27 = 0;
      do {
        if (1 < uVar27) {
          if ((char)uVar27 == '\x02') {
            if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                            (ulong)(uint)((int)local_218 << 5))) goto LAB_0018220a;
          }
          else if (((uVar27 & 0xff) < 2) || ((uVar27 & 0xff) == 3)) {
LAB_0018220a:
            if (((local_238->common).seq_params)->enable_masked_compound != '\0') {
              pMVar10 = (local_220->xd).left_mbmi;
              pMVar11 = (local_220->xd).above_mbmi;
              uVar26 = 0;
              uVar27 = 0;
              if (pMVar11 != (MB_MODE_INFO *)0x0) {
                if (pMVar11->ref_frame[1] < '\x01') {
                  uVar27 = (uint)(pMVar11->ref_frame[0] == '\a') * 3;
                }
                else {
                  uVar27 = *(ushort *)&pMVar11->field_0xa7 >> 8 & 1;
                }
              }
              if (pMVar10 != (MB_MODE_INFO *)0x0) {
                if (pMVar10->ref_frame[1] < '\x01') {
                  uVar26 = (uint)(pMVar10->ref_frame[0] == '\a') * 3;
                }
                else {
                  uVar26 = *(ushort *)&pMVar10->field_0xa7 >> 8 & 1;
                }
              }
              uVar39 = 5;
              if (uVar26 + uVar27 < 5) {
                uVar39 = (ulong)(uVar26 + uVar27);
              }
              paaVar43 = local_228->comp_group_idx_cdf + uVar39;
              uVar27 = od_ec_decode_cdf_q15(&r->ec,*paaVar43,2);
              if (r->allow_update_cdf != '\0') {
                uVar25 = (*paaVar43)[2];
                bVar35 = (char)(uVar25 >> 4) + 4;
                uVar7 = (*paaVar43)[0];
                if ((char)uVar27 < '\x01') {
                  sVar36 = -(uVar7 >> (bVar35 & 0x1f));
                }
                else {
                  sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar35 & 0x1f));
                }
                (*paaVar43)[0] = sVar36 + uVar7;
                (*paaVar43)[2] = uVar25 + (uVar25 < 0x20);
              }
              *(ushort *)&pMVar9->field_0xa7 =
                   *(ushort *)&pMVar9->field_0xa7 & 0xfeff | (ushort)((uVar27 & 1) << 8);
            }
            break;
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != 4);
    }
    uVar39 = local_218;
    pDVar46 = local_220;
    pFVar12 = local_228;
    if ((*(ushort *)&pMVar9->field_0xa7 >> 8 & 1) == 0) {
      pSVar13 = (pAVar54->common).seq_params;
      if ((pSVar13->order_hint_info).enable_dist_wtd_comp == 0) {
        *(ushort *)&pMVar9->field_0xa7 = *(ushort *)&pMVar9->field_0xa7 | 0x200;
        (pMVar9->interinter_comp).type = '\0';
      }
      else {
        pMVar10 = *(local_220->xd).mi;
        bVar32 = pMVar10->ref_frame[0];
        iVar28 = -1;
        if ((byte)(bVar32 - 1) < 8) {
          iVar28 = (pAVar54->common).remapped_ref_idx[bVar32 - 1];
        }
        if (iVar28 == -1) {
          pRVar40 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar40 = (pAVar54->common).ref_frame_map[iVar28];
        }
        bVar32 = pMVar10->ref_frame[1];
        iVar28 = -1;
        if ((byte)(bVar32 - 1) < 8) {
          iVar28 = (pAVar54->common).remapped_ref_idx[bVar32 - 1];
        }
        uVar27 = 0;
        if (iVar28 == -1) {
          pRVar50 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar50 = (pAVar54->common).ref_frame_map[iVar28];
        }
        if (pRVar40 != (RefCntBuffer *)0x0) {
          uVar27 = pRVar40->order_hint;
        }
        iVar28 = 0;
        uVar26 = 0;
        if (pRVar50 != (RefCntBuffer *)0x0) {
          uVar26 = pRVar50->order_hint;
        }
        uVar48 = ((pAVar54->common).cur_frame)->order_hint;
        if ((pSVar13->order_hint_info).enable_order_hint == 0) {
          iVar30 = 0;
        }
        else {
          uVar26 = uVar26 - uVar48;
          uVar52 = 1 << ((byte)(pSVar13->order_hint_info).order_hint_bits_minus_1 & 0x1f);
          iVar28 = (uVar52 - 1 & uVar26) - (uVar52 & uVar26);
          uVar48 = uVar48 - uVar27;
          uVar27 = 1 << ((byte)(pSVar13->order_hint_info).order_hint_bits_minus_1 & 0x1f);
          iVar30 = (uVar27 - 1 & uVar48) - (uVar27 & uVar48);
        }
        pMVar10 = (local_220->xd).left_mbmi;
        pMVar11 = (local_220->xd).above_mbmi;
        if (pMVar11 == (MB_MODE_INFO *)0x0) {
          uVar39 = 0;
        }
        else if (pMVar11->ref_frame[1] < '\x01') {
          uVar39 = (ulong)(pMVar11->ref_frame[0] == '\a');
        }
        else {
          uVar39 = (ulong)(*(ushort *)&pMVar11->field_0xa7 >> 9 & 1);
        }
        if (pMVar10 == (MB_MODE_INFO *)0x0) {
          uVar53 = 0;
        }
        else if (pMVar10->ref_frame[1] < '\x01') {
          uVar53 = (ulong)(pMVar10->ref_frame[0] == '\a');
        }
        else {
          uVar53 = (ulong)(*(ushort *)&pMVar10->field_0xa7 >> 9 & 1);
        }
        iVar14 = -iVar28;
        if (0 < iVar28) {
          iVar14 = iVar28;
        }
        iVar28 = -iVar30;
        if (0 < iVar30) {
          iVar28 = iVar30;
        }
        lVar37 = uVar39 + uVar53 + (ulong)(iVar14 == iVar28) * 3;
        paaVar43 = local_228->compound_index_cdf + lVar37;
        uVar27 = od_ec_decode_cdf_q15(&r->ec,*paaVar43,2);
        if (r->allow_update_cdf != '\0') {
          uVar25 = pFVar12->compound_index_cdf[lVar37][2];
          bVar32 = (char)(uVar25 >> 4) + 4;
          uVar7 = (*paaVar43)[0];
          if ((char)(byte)uVar27 < '\x01') {
            sVar36 = -(uVar7 >> (bVar32 & 0x1f));
          }
          else {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
          }
          (*paaVar43)[0] = sVar36 + uVar7;
          pFVar12->compound_index_cdf[lVar37][2] = uVar25 + (uVar25 < 0x20);
        }
        *(ushort *)&pMVar9->field_0xa7 =
             *(ushort *)&pMVar9->field_0xa7 & 0xfdff | (ushort)((uVar27 & 1) << 9);
        (pMVar9->interinter_comp).type = ~(byte)uVar27 & 1;
      }
    }
    else {
      CVar23 = '\x03';
      if ((7 < bVar32) &&
         (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                      (ulong)(uint)((int)local_218 << 5)))) {
        paaVar43 = local_228->compound_type_cdf + local_218;
        iVar28 = od_ec_decode_cdf_q15(&r->ec,*paaVar43,2);
        if (r->allow_update_cdf != '\0') {
          uVar25 = pFVar12->compound_type_cdf[uVar39][2];
          bVar32 = (char)(uVar25 >> 4) + 4;
          uVar7 = (*paaVar43)[0];
          if ((char)iVar28 < '\x01') {
            sVar36 = -(uVar7 >> (bVar32 & 0x1f));
          }
          else {
            sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
          }
          (*paaVar43)[0] = sVar36 + uVar7;
          pFVar12->compound_type_cdf[uVar39][2] = uVar25 + (uVar25 < 0x20);
        }
        CVar23 = (char)iVar28 + '\x02';
      }
      pFVar12 = local_228;
      (pMVar9->interinter_comp).type = CVar23;
      if (CVar23 == '\x02') {
        lVar37 = (ulong)(uint)((int)local_218 << 5) + local_218 * 2;
        puVar38 = (uint16_t *)((long)local_228->wedge_idx_cdf[0] + lVar37);
        iVar28 = od_ec_decode_cdf_q15(&r->ec,puVar38,0x10);
        if (r->allow_update_cdf != '\0') {
          uVar25 = *(ushort *)((long)pFVar12->wedge_idx_cdf[0] + lVar37 + 0x20);
          bVar32 = (char)(uVar25 >> 4) + 5;
          lVar51 = 0;
          do {
            uVar7 = puVar38[lVar51];
            if (lVar51 < (char)iVar28) {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            puVar38[lVar51] = sVar36 + uVar7;
            lVar51 = lVar51 + 1;
          } while (lVar51 != 0xf);
          psVar2 = (short *)((long)pFVar12->wedge_idx_cdf[0] + lVar37 + 0x20);
          *psVar2 = *psVar2 + (ushort)(uVar25 < 0x20);
        }
        (pMVar9->interinter_comp).wedge_index = (char)iVar28;
        iVar28 = od_ec_decode_bool_q15(&r->ec,0x4000);
        (pMVar9->interinter_comp).wedge_sign = (int8_t)iVar28;
      }
      else {
        iVar28 = od_ec_decode_bool_q15(&r->ec,0x4000);
        (pMVar9->interinter_comp).mask_type = (DIFFWTD_MASK_TYPE)iVar28;
      }
    }
  }
  uVar27 = (uint)(local_238->common).features.interp_filter;
  pMVar10 = *(pDVar46->xd).mi;
  if (((pMVar10->field_0xa7 & 0x40) == 0) && (pMVar10->motion_mode != '\x02')) {
    uVar18 = ((local_238->common).seq_params)->enable_dual_filter;
    pFVar12 = (local_220->xd).tile_ctx;
    if ((pMVar10->mode == '\x17') || (pMVar10->mode == '\x0f')) {
      bVar32 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar10->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar10->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar10->bsize]) {
        bVar32 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar10->bsize];
      }
      if (1 < bVar32) {
        lVar37 = 0;
        do {
          if ((local_220->xd).global_motion[pMVar10->ref_frame[lVar37]].wmtype == '\x01')
          goto LAB_0018282a;
        } while (('\0' < pMVar10->ref_frame[1]) &&
                (bVar55 = lVar37 == 0, lVar37 = lVar37 + 1, bVar55));
        goto LAB_001826d8;
      }
    }
LAB_0018282a:
    if (uVar27 == 4) {
      local_242 = 0;
      lVar37 = 0;
      do {
        iVar28 = av1_get_pred_context_switchable_interp(&local_220->xd,(int)lVar37);
        paaVar45 = pFVar12->switchable_interp_cdf + iVar28;
        iVar28 = od_ec_decode_cdf_q15(&r->ec,*paaVar45,3);
        if (r->allow_update_cdf != '\0') {
          uVar25 = (*paaVar45)[3];
          bVar32 = (char)(uVar25 >> 4) + 4;
          lVar51 = 0;
          do {
            uVar7 = (*paaVar45)[lVar51];
            if (lVar51 < (char)iVar28) {
              sVar36 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar32 & 0x1f));
            }
            else {
              sVar36 = -(uVar7 >> (bVar32 & 0x1f));
            }
            (*paaVar45)[lVar51] = sVar36 + uVar7;
            lVar51 = lVar51 + 1;
          } while (lVar51 != 2);
          (*paaVar45)[3] = (*paaVar45)[3] + (ushort)(uVar25 < 0x20);
        }
        *(char *)((long)&local_242 + lVar37) = (char)iVar28;
        if (uVar18 == '\0') {
          local_242 = CONCAT11((undefined1)local_242,(undefined1)local_242);
          break;
        }
        bVar55 = lVar37 == 0;
        lVar37 = lVar37 + 1;
      } while (bVar55);
      (pMVar9->interp_filters).as_filters.x_filter = local_242 >> 8;
      (pMVar9->interp_filters).as_filters.y_filter = local_242 & 0xff;
    }
    else {
      (pMVar9->interp_filters).as_int = uVar27 << 0x10 | uVar27;
    }
  }
  else {
LAB_001826d8:
    uVar26 = 0;
    if (uVar27 != 4) {
      uVar26 = uVar27;
    }
    (pMVar9->interp_filters).as_int = uVar26 << 0x10 | uVar26;
  }
  pDVar46 = local_220;
  if (pMVar9->motion_mode == '\x02') {
    iVar28 = (local_220->xd).mi_row;
    iVar30 = (local_220->xd).mi_col;
    (pMVar9->wm_params).wmtype = '\x03';
    (pMVar9->wm_params).invalid = '\0';
    if (1 < pMVar9->num_proj_ref) {
      uVar18 = av1_selectSamples((MV *)local_230,pts,pts_inref,(uint)pMVar9->num_proj_ref,
                                 (BLOCK_SIZE)local_218);
      pMVar9->num_proj_ref = uVar18;
    }
    iVar28 = av1_find_projection((uint)pMVar9->num_proj_ref,pts,pts_inref,(BLOCK_SIZE)local_218,
                                 (int)pMVar9->mv[0].as_mv.row,(int)pMVar9->mv[0].as_mv.col,
                                 &pMVar9->wm_params,iVar28,iVar30);
    if (iVar28 != 0) {
      (pMVar9->wm_params).invalid = '\x01';
    }
  }
  if (((local_238->common).seq_params)->monochrome == '\0') {
    uVar27 = 1;
    if ((pDVar46->xd).is_chroma_ref != true) goto LAB_001827bf;
    pMVar9 = *(pDVar46->xd).mi;
    if ((pMVar9->field_0xa7 & 0x80) == 0) {
      uVar27 = 0;
      if (pMVar9->ref_frame[0] < '\x01') {
        uVar27 = (uint)(pMVar9->uv_mode == '\r');
      }
      goto LAB_001827bf;
    }
  }
  uVar27 = 0;
LAB_001827bf:
  (pDVar46->xd).cfl.store_y = uVar27;
  return;
switchD_00181588_caseD_d:
  local_230->as_int = (uint32_t)iVar29;
  goto LAB_00181c94;
}

Assistant:

static void read_inter_frame_mode_info(AV1Decoder *const pbi,
                                       DecoderCodingBlock *dcb, aom_reader *r) {
  AV1_COMMON *const cm = &pbi->common;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int inter_block = 1;

  mbmi->mv[0].as_int = 0;
  mbmi->mv[1].as_int = 0;
  mbmi->segment_id = read_inter_segment_id(cm, xd, 1, r);

  mbmi->skip_mode = read_skip_mode(cm, xd, mbmi->segment_id, r);

  if (mbmi->skip_mode)
    mbmi->skip_txfm = 1;
  else
    mbmi->skip_txfm = read_skip_txfm(cm, xd, mbmi->segment_id, r);

  if (!cm->seg.segid_preskip)
    mbmi->segment_id = read_inter_segment_id(cm, xd, 0, r);

  read_cdef(cm, r, xd);

  read_delta_q_params(cm, xd, r);

  if (!mbmi->skip_mode)
    inter_block = read_is_inter_block(cm, xd, mbmi->segment_id, r);

  mbmi->current_qindex = xd->current_base_qindex;

  xd->above_txfm_context =
      cm->above_contexts.txfm[xd->tile.tile_row] + xd->mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (xd->mi_row & MAX_MIB_MASK);

  if (inter_block)
    read_inter_block_mode_info(pbi, dcb, mbmi, r);
  else
    read_intra_block_mode_info(cm, xd, mbmi, r);
}